

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcomp.c
# Opt level: O0

void objcomp(mcmcxdef *mctx,objnum objn,int for_debug)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  mcmcxdef *pmVar6;
  uchar *p_00;
  long lVar7;
  int in_EDX;
  ushort in_SI;
  undefined8 *in_RDI;
  int cnt;
  prpdef *nxt;
  prpdef *p;
  objdef *objptr;
  mcmon in_stack_ffffffffffffff8e;
  mcmcxdef *in_stack_ffffffffffffff90;
  mcmcxdef *in_stack_ffffffffffffff98;
  uint local_2c;
  mcmcxdef *mctx_00;
  
  puVar5 = mcmlck(in_stack_ffffffffffffff98,(mcmon)((ulong)in_stack_ffffffffffffff90 >> 0x30));
  local_2c = osrp2(puVar5 + 6);
  uVar3 = osrp2(puVar5 + 4);
  pmVar6 = (mcmcxdef *)(puVar5 + (long)(int)((uVar3 & 0xffff) << 1) + 0xe);
  for (local_2c = local_2c & 0xffff; local_2c != 0; local_2c = local_2c - 1) {
    mctx_00 = pmVar6;
    iVar4 = osrp2((uchar *)((long)&pmVar6->mcmcxgl + 3));
    pmVar6 = (mcmcxdef *)((long)pmVar6->mcmcxmtb + (long)iVar4 + -0x2a);
    if (((ulong)mctx_00->mcmcxgl & 0x20000000000) != 0) {
      if (in_EDX == 0) {
        *(byte *)((long)&mctx_00->mcmcxgl + 5) = *(byte *)((long)&mctx_00->mcmcxgl + 5) & 0xf8;
        osrp2(mctx_00);
        uVar2 = (ulong)pmVar6 >> 0x30;
        uVar1 = (ulong)pmVar6 >> 0x20;
        iVar4 = (int)pmVar6;
        pmVar6 = mctx_00;
        objdelp(mctx_00,(objnum)uVar2,(prpnum)uVar1,iVar4);
      }
      else {
        *(byte *)((long)&mctx_00->mcmcxgl + 5) = *(byte *)((long)&mctx_00->mcmcxgl + 5) | 4;
        *(byte *)((long)&mctx_00->mcmcxgl + 5) = *(byte *)((long)&mctx_00->mcmcxgl + 5) & 0xfd;
      }
    }
  }
  p_00 = puVar5 + 10;
  uVar3 = osrp2(puVar5 + 6);
  oswp2(p_00,uVar3 & 0xffff);
  uVar3 = osrp2(puVar5 + 8);
  oswp2(puVar5 + 0xc,uVar3 & 0xffff);
  local_2c = osrp2(puVar5 + 6);
  uVar3 = osrp2(puVar5 + 4);
  puVar5 = puVar5 + (long)(int)((uVar3 & 0xffff) << 1) + 0xe;
  for (local_2c = local_2c & 0xffff; local_2c != 0; local_2c = local_2c - 1) {
    puVar5[5] = puVar5[5] | 1;
    in_stack_ffffffffffffff90 = (mcmcxdef *)(puVar5 + 6);
    iVar4 = osrp2(puVar5 + 3);
    puVar5 = (uchar *)((long)in_stack_ffffffffffffff90->mcmcxmtb + (long)iVar4 + -0x30);
  }
  lVar7 = *(long *)(*(long *)*in_RDI +
                   (long)((int)(uint)*(ushort *)
                                      (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                                      (long)(int)(in_SI & 0xff) * 2) >> 8) * 8) +
          (long)(int)(*(ushort *)
                       (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] + (long)(int)(in_SI & 0xff) * 2) &
                     0xff) * 0x20;
  *(ushort *)(lVar7 + 0x14) = *(ushort *)(lVar7 + 0x14) | 1;
  mcmunlck(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e);
  return;
}

Assistant:

void objcomp(mcmcxdef *mctx, objnum objn, int for_debug)
{
    objdef *objptr;
    prpdef *p;
    prpdef *nxt;
    int     cnt;
    
    /* lock object */
    objptr = (objdef *)mcmlck(mctx, (mcmon)objn);

    /* 
     *   first, go through the properties, and delete each one that's
     *   marked as ignored 
     */
    for (cnt = objnprop(objptr), p = objprp(objptr) ; cnt != 0 ;
         p = nxt, --cnt)
    {
        /* remember the next property */
        nxt = objpnxt(p);

        /* if this is marked as being ignored, delete it */
        if ((prpflg(p) & PRPFIGN) != 0)
        {
            /* 
             *   Delete the property.  If we're compiling in debug mode,
             *   don't really delete anything, but simply mark the
             *   property as deleted; this is necessary because certain
             *   debug records are not self-relative, hence are not
             *   tolerant of changes to the internal structure of the
             *   object.  If we're not compiling for debugging, we can
             *   actually delete properties, because all non-debug code is
             *   completely self-relative and thus can be moved around
             *   inside the object without any problems.  
             */
            if (for_debug)
            {
                /* simply mark the property as deleted */
                prpflg(p) |= PRPFDEL;

                /* 
                 *   clear the IGNORE flag, since we IGNORE and DELETED
                 *   are mutually exclusive 
                 */
                prpflg(p) &= ~PRPFIGN;
            }
            else
            {
                /* clear the flags so we can really delete it */
                prpflg(p) &= ~(PRPFORG | PRPFIGN | PRPFDEL);

                /* delete it */
                objdelp(mctx, objn, (prpnum)prpprop(p), FALSE);

                /* 
                 *   continue from the present location, since we moved
                 *   the next property to the current location 
                 */
                nxt = p;
            }
        }
    }
    
    /* set static entries:  free space pointer, and number of properties */
    objsetst(objptr, objnprop(objptr));
    objsetrst(objptr, objfree(objptr));

    /* go through properties, marking each as original */
    for (cnt = objnprop(objptr), p = objprp(objptr) ; cnt != 0 ;
         p = objpnxt(p), --cnt)
    {
        assert(p < objptr + mcmobjsiz(mctx, (mcmon)objn));
        prpflg(p) |= PRPFORG;             /* set ORIGINAL flag for property */
    }
    
    /* mark object changed, and unlock it */
    mcmtch(mctx, objn);
    mcmunlck(mctx, objn);
}